

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_sub_mips(floatx80 a,floatx80 b,float_status *status)

{
  ulong uVar1;
  flag zSign;
  floatx80 fVar2;
  
  if (((long)a.low < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
     && (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 ||
         (long)b.low < 0)) {
    uVar1 = (a._8_8_ & 0xffff) >> 0xf;
    zSign = (flag)uVar1;
    if ((ushort)uVar1 == (ushort)(b.high >> 0xf)) {
      fVar2 = subFloatx80Sigs(a,b,zSign,status);
    }
    else {
      fVar2 = addFloatx80Sigs(a,b,zSign,status);
    }
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips(float_status *)");
    }
    fVar2._10_6_ = b.low._2_6_;
    fVar2.high = 0xffff;
    fVar2.low = 0xc000000000000000;
  }
  return fVar2;
}

Assistant:

floatx80 floatx80_sub(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSign = extractFloatx80Sign( a );
    bSign = extractFloatx80Sign( b );
    if ( aSign == bSign ) {
        return subFloatx80Sigs(a, b, aSign, status);
    }
    else {
        return addFloatx80Sigs(a, b, aSign, status);
    }

}